

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRouter.h
# Opt level: O0

pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool> * __thiscall
uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::getUrlSegment
          (HttpRouter<uWS::HttpContextData<true>::RouterData> *this,int urlSegment)

{
  size_type sVar1;
  size_type sVar2;
  size_t *psVar3;
  int in_EDX;
  size_type in_RSI;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool> *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  size_type segmentLength;
  undefined7 in_stack_ffffffffffffff88;
  bool in_stack_ffffffffffffff8f;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  undefined1 in_stack_ffffffffffffff90 [16];
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa0;
  char *local_58;
  size_t local_50;
  char *local_48;
  size_t local_40;
  char *local_38;
  bool local_21;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  int local_c;
  
  local_c = in_EDX;
  if (*(int *)(in_RSI + 0x6c0) < in_EDX) {
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)(in_RSI + 0x70));
    if ((sVar1 == 0) || (99 < local_c)) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_20);
      local_21 = true;
      std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool>::pair<bool,_true>
                (in_RDI,&local_20,&local_21);
      return in_RDI;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
              ((basic_string_view<char,_std::char_traits<char>_> *)(in_RSI + 0x70),1);
    this_00 = in_stack_ffffffffffffff90._0_8_;
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find
                      (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff90[0xf],(size_type)this_00);
    if (sVar2 == 0xffffffffffffffff) {
      std::basic_string_view<char,_std::char_traits<char>_>::length
                ((basic_string_view<char,_std::char_traits<char>_> *)(in_RSI + 0x70));
      bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (this_00,CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                         in_RSI);
      psVar3 = (size_t *)(in_RSI + 0x80 + (long)local_c * 0x10);
      local_40 = bVar4._M_len;
      *psVar3 = local_40;
      local_38 = bVar4._M_str;
      psVar3[1] = (size_t)local_38;
      *(int *)(in_RSI + 0x6c0) = *(int *)(in_RSI + 0x6c0) + 1;
      bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (this_00,CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                         in_RSI);
      local_50 = bVar4._M_len;
      *(size_t *)(in_RSI + 0x70) = local_50;
      local_48 = bVar4._M_str;
      *(char **)(in_RSI + 0x78) = local_48;
    }
    else {
      bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (this_00,CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                         in_RSI);
      psVar3 = (size_t *)(in_RSI + 0x80 + (long)local_c * 0x10);
      *psVar3 = bVar4._M_len;
      local_58 = bVar4._M_str;
      psVar3[1] = (size_t)local_58;
      *(int *)(in_RSI + 0x6c0) = *(int *)(in_RSI + 0x6c0) + 1;
      bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (this_00,CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
                         in_RSI);
      *(size_t *)(in_RSI + 0x70) = bVar4._M_len;
      *(char **)(in_RSI + 0x78) = bVar4._M_str;
    }
  }
  std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool>::
  pair<std::basic_string_view<char,_std::char_traits<char>_>_&,_bool,_true>
            (in_RDI,(basic_string_view<char,_std::char_traits<char>_> *)
                    (in_RSI + 0x80 + (long)local_c * 0x10),(bool *)&stack0xffffffffffffff8f);
  return in_RDI;
}

Assistant:

inline std::pair<std::string_view, bool> getUrlSegment(int urlSegment) {
        if (urlSegment > urlSegmentTop) {
            /* Signal as STOP when we have no more URL or stack space */
            if (!currentUrl.length() || urlSegment > 99) {
                return {{}, true};
            }

            /* We always stand on a slash here, so step over it */
            currentUrl.remove_prefix(1);

            auto segmentLength = currentUrl.find('/');
            if (segmentLength == std::string::npos) {
                segmentLength = currentUrl.length();

                /* Push to url segment vector */
                urlSegmentVector[urlSegment] = currentUrl.substr(0, segmentLength);
                urlSegmentTop++;

                /* Update currentUrl */
                currentUrl = currentUrl.substr(segmentLength);
            } else {
                /* Push to url segment vector */
                urlSegmentVector[urlSegment] = currentUrl.substr(0, segmentLength);
                urlSegmentTop++;

                /* Update currentUrl */
                currentUrl = currentUrl.substr(segmentLength);
            }
        }
        /* In any case we return it */
        return {urlSegmentVector[urlSegment], false};
    }